

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O3

Var * __thiscall kratos::Generator::var(Generator *this,string *var_name,uint32_t width)

{
  Var *pVVar1;
  initializer_list<unsigned_int> __l;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  uint local_30;
  allocator_type local_29;
  
  local_30 = 1;
  __l._M_len = 1;
  __l._M_array = &local_30;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_48,__l,&local_29);
  pVVar1 = var(this,var_name,width,&local_48,false);
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return pVVar1;
}

Assistant:

Var &Generator::var(const std::string &var_name, uint32_t width) {
    return var(var_name, width, std::vector<uint32_t>{1});
}